

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O3

int bcache_write(filemgr *file,bid_t bid,void *buf,bcache_dirty_t dirty,bool final_write,
                bool ignore_if_exist)

{
  bcache_shard *__lock;
  char cVar1;
  ulong uVar2;
  bcache_shard *pbVar3;
  int iVar4;
  fdb_status fVar5;
  fnamedic_item *pfVar6;
  hash_elem *phVar7;
  list_elem *plVar8;
  fnamedic_item *fname_item;
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  avl_node **item;
  avl_tree *tree;
  size_t __n;
  ulong uVar13;
  timeval tp;
  bcache_item query;
  timeval local_80;
  bid_t local_70;
  hash_elem local_60 [2];
  
  pfVar6 = (file->bcache)._M_b._M_p;
  if (pfVar6 == (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    pfVar6 = (file->bcache)._M_b._M_p;
    if (pfVar6 == (fnamedic_item *)0x0) {
      pfVar6 = _fname_create(file);
    }
    pthread_spin_unlock(&bcache_lock);
  }
  gettimeofday(&local_80,(__timezone_ptr_t)0x0);
  (pfVar6->access_timestamp).super___atomic_base<unsigned_long>._M_i =
       local_80.tv_sec * 1000000 + local_80.tv_usec;
  uVar11 = bid % pfVar6->num_shards;
  local_70 = bid;
  pthread_spin_lock(&pfVar6->shards[uVar11].lock);
  phVar7 = hash_find(&pfVar6->shards[uVar11].hashtable,local_60);
  if (phVar7 == (hash_elem *)0x0) {
    pthread_spin_lock(&freelist_lock);
    plVar8 = list_pop_front(&freelist);
    while (plVar8 == (list_elem *)0x0) {
      pthread_spin_unlock(&freelist_lock);
      pthread_spin_unlock(&pfVar6->shards[uVar11].lock);
      while( true ) {
        do {
          fname_item = _bcache_get_victim();
        } while (fname_item == (fnamedic_item *)0x0);
        if ((fname_item->nitems).super___atomic_base<unsigned_long>._M_i != 0) break;
        LOCK();
        (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
             (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
      }
      LOCK();
      (fname_item->nvictim).super___atomic_base<unsigned_long>._M_i =
           (fname_item->nvictim).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      uVar2 = fname_item->num_shards;
      iVar4 = rand();
      uVar12 = (ulong)(long)iVar4 % uVar2;
      uVar13 = uVar2;
      do {
        uVar9 = uVar12 + 1;
        uVar12 = 0;
        if (uVar9 != uVar2) {
          uVar12 = uVar9;
        }
        pbVar3 = fname_item->shards;
        __lock = pbVar3 + uVar12;
        pthread_spin_lock(&__lock->lock);
        if (((pbVar3[uVar12].cleanlist.head == (list_elem *)0x0) &&
            ((__lock->tree).root == (avl_node *)0x0)) &&
           ((__lock->tree_idx).root == (avl_node *)0x0)) {
LAB_0010438b:
          pthread_spin_unlock(&__lock->lock);
        }
        else {
          plVar8 = list_pop_back(&pbVar3[uVar12].cleanlist);
          if (plVar8 != (list_elem *)0x0) {
            cVar1 = *(char *)((long)&plVar8[1].prev + 1);
            if ((cVar1 != '\0') && (bcache_global_config.do_not_cache_doc_blocks == false)) {
              *(char *)((long)&plVar8[1].prev + 1) = cVar1 + -1;
              list_push_front(&pbVar3[uVar12].cleanlist,plVar8);
              goto LAB_0010438b;
            }
            LOCK();
            (fname_item->nitems).super___atomic_base<unsigned_long>._M_i =
                 (fname_item->nitems).super___atomic_base<unsigned_long>._M_i - 1;
            UNLOCK();
            hash_remove(&__lock->hashtable,(hash_elem *)&plVar8[-2].next);
            _bcache_release_freeblock((bcache_item *)&plVar8[-3].next);
            pthread_spin_unlock(&__lock->lock);
            break;
          }
          pthread_spin_unlock(&__lock->lock);
          fVar5 = _flush_dirty_blocks(fname_item,true,false,false);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
        }
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      LOCK();
      (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
           (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      pthread_spin_lock(&pfVar6->shards[uVar11].lock);
      pthread_spin_lock(&freelist_lock);
      plVar8 = list_pop_front(&freelist);
    }
    LOCK();
    freelist_count.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)freelist_count.super___atomic_base<unsigned_long>._M_i - 1);
    UNLOCK();
    pthread_spin_unlock(&freelist_lock);
    item = (avl_node **)&plVar8[-3].next;
    phVar7 = hash_find(&pfVar6->shards[uVar11].hashtable,local_60);
    if (phVar7 == (hash_elem *)0x0) {
      plVar8[-3].next = (list_elem *)bid;
      LOCK();
      *(undefined1 *)&plVar8[1].prev = 4;
      UNLOCK();
      hash_insert(&pfVar6->shards[uVar11].hashtable,(hash_elem *)&plVar8[-2].next);
    }
    else {
      _bcache_release_freeblock((bcache_item *)item);
      item = &phVar7[-1].avl.left;
    }
  }
  else {
    if (ignore_if_exist) {
      pthread_spin_unlock(&pfVar6->shards[uVar11].lock);
      return 0;
    }
    item = &phVar7[-1].avl.left;
  }
  if ((*(byte *)(item + 7) & 4) != 0) {
    LOCK();
    (pfVar6->nitems).super___atomic_base<unsigned_long>._M_i =
         (pfVar6->nitems).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if (((*(byte *)(item + 7) & 1) == 0) && ((*(byte *)(item + 7) & 4) == 0)) {
    list_remove(&pfVar6->shards[uVar11].cleanlist,(list_elem *)(item + 5));
  }
  LOCK();
  *(byte *)(item + 7) = *(byte *)(item + 7) & 0xfb;
  UNLOCK();
  if (dirty == BCACHE_REQ_DIRTY) {
    if ((*(byte *)(item + 7) & 1) == 0) {
      puVar10 = (undefined8 *)malloc(0x20);
      *puVar10 = item;
      if (*(char *)((long)buf + (long)bcache_blocksize + -1) == -1) {
        tree = &pfVar6->shards[uVar11].tree_idx;
      }
      else {
        if (final_write) {
          LOCK();
          *(byte *)(item + 7) = *(byte *)(item + 7) | 2;
          UNLOCK();
          LOCK();
          (pfVar6->nimmutable).super___atomic_base<unsigned_long>._M_i =
               (pfVar6->nimmutable).super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
        }
        tree = &pfVar6->shards[uVar11].tree;
      }
      avl_insert(tree,(avl_node *)(puVar10 + 1),_dirty_cmp);
    }
    LOCK();
    *(byte *)(item + 7) = *(byte *)(item + 7) | 1;
    UNLOCK();
  }
  else if ((*(byte *)(item + 7) & 1) == 0) {
    list_push_front(&pfVar6->shards[uVar11].cleanlist,(list_elem *)(item + 5));
    LOCK();
    *(byte *)(item + 7) = *(byte *)(item + 7) & 0xfe;
    UNLOCK();
  }
  __n = (size_t)bcache_blocksize;
  memcpy(item[1],buf,__n);
  *(bool *)((long)item + 0x39) = *(char *)((long)item[1] + (__n - 1)) == -1;
  pthread_spin_unlock(&pfVar6->shards[uVar11].lock);
  return bcache_blocksize;
}

Assistant:

int bcache_write(struct filemgr *file,
                 bid_t bid,
                 void *buf,
                 bcache_dirty_t dirty,
                 bool final_write,
                 bool ignore_if_exist)
{
    struct hash_elem *h = NULL;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss
        // get a free block
        while ((item = _bcache_alloc_freeblock()) == NULL) {
            // no free block .. perform eviction
            spin_unlock(&fname_new->shards[shard_num].lock);

            _bcache_evict(fname_new);

            spin_lock(&fname_new->shards[shard_num].lock);
        }

        // re-search hash table
        h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
        if (h == NULL) {
            // insert into hash table
            item->bid = bid;
            item->flag = BCACHE_FREE;
            hash_insert(&fname_new->shards[shard_num].hashtable, &item->hash_elem);
            h = &item->hash_elem;
        } else {
            // insert into freelist again
            _bcache_release_freeblock(item);
            item = _get_entry(h, struct bcache_item, hash_elem);
        }
    } else {
        // cache hit.
        if (ignore_if_exist) {
            spin_unlock(&fname_new->shards[shard_num].lock);
            return 0;
        }
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    fdb_assert(h, h, NULL);

    if (item->flag & BCACHE_FREE) {
        atomic_incr_uint64_t(&fname_new->nitems);
    }

    // remove from the list if the block is in clean list
    if (!(item->flag & BCACHE_DIRTY) && !(item->flag & BCACHE_FREE)) {
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
    }
    item->flag &= ~BCACHE_FREE;

    if (dirty == BCACHE_REQ_DIRTY) {
        // DIRTY request
        // to avoid re-insert already existing item into tree
        if (!(item->flag & BCACHE_DIRTY)) {
            // dirty block
            // insert into tree
            struct dirty_item *ditem;
            uint8_t marker;

            ditem = (struct dirty_item *)
                    mempool_alloc(sizeof(struct dirty_item));
            ditem->item = item;

            marker = *((uint8_t*)buf + bcache_blocksize-1);
            if (marker == BLK_MARKER_BNODE) {
                // b-tree node
                avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
            } else {
                if (final_write) {
                    item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                    atomic_incr_uint64_t(&fname_new->nimmutable);
                }
                avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                           _dirty_cmp);
            }
        }
        item->flag |= BCACHE_DIRTY;
    } else {
        // CLEAN request
        // insert into clean list only when it was originally clean
        if (!(item->flag & BCACHE_DIRTY)) {
            list_push_front(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
            item->flag &= ~(BCACHE_DIRTY);
        }
    }

    memcpy(item->addr, buf, bcache_blocksize);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return bcache_blocksize;
}